

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFormatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  deUint32 format;
  deUint32 dataType;
  Context *context;
  _Alloc_hider description;
  _Alloc_hider name;
  char *__s;
  long *plVar2;
  Texture2DRenderCase *this_00;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  size_type *psVar6;
  int row;
  long lVar7;
  long lVar8;
  long lVar9;
  allocator<char> *__a;
  undefined4 uVar10;
  allocator<char> local_c9;
  Mat3 local_c8;
  TestNode *local_98;
  string descriptionBase;
  string nameBase;
  long *local_50 [2];
  long local_40 [2];
  
  pfVar1 = local_c8.m_data.m_data[1].m_data + 1;
  lVar9 = 0;
  local_98 = (TestNode *)this;
  do {
    __a = (allocator<char> *)&local_c8;
    format = init::texFormats[lVar9].format;
    dataType = init::texFormats[lVar9].dataType;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,init::texFormats[lVar9].name,__a);
    __s = glu::getTextureFormatName(format);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_c9);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar5 = plVar2 + 2;
    if ((float *)*plVar2 == (float *)plVar5) {
      local_c8.m_data.m_data[1].m_data._4_8_ = *plVar5;
      local_c8.m_data.m_data[2].m_data._0_8_ = plVar2[3];
      local_c8.m_data.m_data[0].m_data._0_8_ = pfVar1;
    }
    else {
      local_c8.m_data.m_data[1].m_data._4_8_ = *plVar5;
      local_c8.m_data.m_data[0].m_data._0_8_ = (float *)*plVar2;
    }
    local_c8.m_data.m_data._8_8_ = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    glu::getTypeName(dataType);
    plVar2 = (long *)std::__cxx11::string::append((char *)__a);
    descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
    psVar6 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar6) {
      descriptionBase.field_2._M_allocated_capacity = *psVar6;
      descriptionBase.field_2._8_8_ = plVar2[3];
    }
    else {
      descriptionBase.field_2._M_allocated_capacity = *psVar6;
      descriptionBase._M_dataplus._M_p = (pointer)*plVar2;
    }
    descriptionBase._M_string_length = plVar2[1];
    *plVar2 = (long)psVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((float *)local_c8.m_data.m_data[0].m_data._0_8_ != pfVar1) {
      operator_delete((void *)local_c8.m_data.m_data[0].m_data._0_8_,
                      local_c8.m_data.m_data[1].m_data._4_8_ + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    this_00 = (Texture2DRenderCase *)operator_new(0x220);
    name = nameBase._M_dataplus;
    description = descriptionBase._M_dataplus;
    context = (Context *)local_98[1]._vptr_TestNode;
    local_c8.m_data.m_data[1].m_data[1] = 0.0;
    local_c8.m_data.m_data[1].m_data[2] = 0.0;
    local_c8.m_data.m_data[2].m_data[0] = 0.0;
    local_c8.m_data.m_data[2].m_data[1] = 0.0;
    local_c8.m_data.m_data[0].m_data[0] = 0.0;
    local_c8.m_data.m_data[0].m_data[1] = 0.0;
    local_c8.m_data.m_data[0].m_data[2] = 0.0;
    local_c8.m_data.m_data[1].m_data[0] = 0.0;
    local_c8.m_data.m_data[2].m_data[2] = 0.0;
    lVar3 = 0;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar3 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(__a + lVar8) = uVar10;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x24);
      lVar7 = lVar7 + 1;
      __a = __a + 4;
      lVar3 = lVar3 + 0xc;
    } while (lVar7 != 3);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,name._M_p,description._M_p,format,dataType,0x812f,0x812f,0x2600,
               0x2600,&local_c8,1,false);
    tcu::TestNode::addChild(local_98,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    paVar4 = &nameBase.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != paVar4) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
      paVar4 = extraout_RAX;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  return (int)paVar4;
}

Assistant:

void TextureFormatTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}